

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::Reflect<1>::doExpand
          (Reflect<1> *this,ExpandContext *ctx,ArgExprs *args)

{
  ExprP<float> *x;
  ExprP<float> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  ExprP<float> dotNI;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> SStack_b8;
  SharedPtr<const_vkt::shaderexecutor::Variable<float>_> local_a8;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_98;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_88;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_78;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_68;
  SharedPtr<const_vkt::shaderexecutor::Expr<float>_> local_58;
  string local_48;
  float local_28;
  float local_24;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"dotNI",(allocator<char> *)&local_98);
  x = in_RCX + 1;
  dot((Functions *)&SStack_b8,x,in_RCX);
  bindExpression<float>
            ((shaderexecutor *)&local_a8,&local_48,(ExpandContext *)args,(ExprP<float> *)&SStack_b8)
  ;
  VariableP::operator_cast_to_ExprP((VariableP *)&local_88);
  de::SharedPtr<const_vkt::shaderexecutor::Variable<float>_>::release(&local_a8);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&SStack_b8);
  std::__cxx11::string::~string((string *)&local_48);
  shaderexecutor::operator*((shaderexecutor *)&SStack_b8,x,(ExprP<float> *)&local_88);
  local_24 = 2.0;
  constant<float>((shaderexecutor *)&local_98,&local_24);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_a8,(ExprP<float> *)&SStack_b8,(ExprP<float> *)&local_98);
  local_28 = 2.0;
  constant<float>((shaderexecutor *)&local_78,&local_28);
  shaderexecutor::operator*
            ((shaderexecutor *)&local_68,(ExprP<float> *)&local_88,(ExprP<float> *)&local_78);
  shaderexecutor::operator*((shaderexecutor *)&local_58,x,(ExprP<float> *)&local_68);
  alternatives<float>((shaderexecutor *)&local_48,(ExprP<float> *)&local_a8,
                      (ExprP<float> *)&local_58);
  shaderexecutor::operator-((shaderexecutor *)this,in_RCX,(ExprP<float> *)&local_48);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_48);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_58);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_68);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_78);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release
            ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)&local_a8);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_98);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&SStack_b8);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::release(&local_88);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext& ctx, const ArgExprs& args) const
	{
		const ExprP<Arg0>&	i		= args.a;
		const ExprP<Arg1>&	n		= args.b;
		const ExprP<float>	dotNI	= bindExpression("dotNI", ctx, dot(n, i));

		return i - alternatives((n * dotNI) * constant(2.0f),
								n * (dotNI * constant(2.0f)));
	}